

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::
DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
::findEntry(DHMap<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *this,uint *key)

{
  Entry *pEVar1;
  uint uVar2;
  uint uVar3;
  Entry *pEVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  ulong uVar7;
  Entry *pEVar8;
  uint local_c;
  
  uVar2 = this->_capacity;
  if (uVar2 == 0) {
    pEVar8 = (Entry *)0x0;
  }
  else {
    local_c = *key;
    uVar5 = 0x811c9dc5;
    lVar6 = 0;
    do {
      uVar5 = (*(byte *)((long)&local_c + lVar6) ^ uVar5) * 0x1000193;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    uVar7 = (ulong)uVar5 % (ulong)uVar2;
    pEVar4 = this->_entries;
    uVar5 = pEVar4[uVar7].field_0._infoData;
    uVar3 = this->_timestamp;
    pEVar8 = (Entry *)0x0;
    if (uVar5 >> 2 == uVar3) {
      if (pEVar4[uVar7]._key == local_c) {
        pEVar8 = (Entry *)0x0;
        if ((uVar5 & 1) == 0) {
          pEVar8 = pEVar4 + uVar7;
        }
      }
      else if ((uVar5 & 2) == 0) {
        pEVar8 = (Entry *)0x0;
      }
      else {
        do {
          uVar7 = (ulong)((int)uVar7 + local_c % uVar2 + (uint)(local_c % uVar2 == 0)) %
                  (ulong)uVar2;
          pEVar1 = pEVar4 + uVar7;
          uVar5 = (uint)(pEVar1->field_0)._infoData >> 2;
          if (uVar5 != uVar3) break;
        } while (pEVar1->_key != local_c);
        pEVar8 = (Entry *)0x0;
        if (((pEVar1->field_0)._infoData & 1U) == 0 && uVar5 == uVar3) {
          pEVar8 = pEVar1;
        }
      }
    }
  }
  return pEVar8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }